

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O2

REF_STATUS ref_search_free(REF_SEARCH ref_search)

{
  if (ref_search != (REF_SEARCH)0x0) {
    free(ref_search->children_ball);
    free(ref_search->radius);
    free(ref_search->pos);
    free(ref_search->right);
    free(ref_search->left);
    free(ref_search->item);
    free(ref_search);
    return 0;
  }
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_search_free(REF_SEARCH ref_search) {
  if (NULL == (void *)ref_search) return REF_NULL;
  ref_free(ref_search->children_ball);
  ref_free(ref_search->radius);
  ref_free(ref_search->pos);
  ref_free(ref_search->right);
  ref_free(ref_search->left);
  ref_free(ref_search->item);
  ref_free(ref_search);
  return REF_SUCCESS;
}